

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Performance::lightFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLights,bool isVertexCase,
          LightType lightType)

{
  undefined3 in_register_00000009;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string ndxStr;
  int local_39c;
  int local_398;
  int local_394;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = CONCAT31(in_register_00000009,isVertexCase);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_39c = (int)this;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_398 = numLights;
  if (numLights == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (local_2f0._M_dataplus._M_p._0_4_ = 0; (int)local_2f0._M_dataplus._M_p < local_39c;
        local_2f0._M_dataplus._M_p._0_4_ = (int)local_2f0._M_dataplus._M_p + 1) {
      de::toString<int>(&local_270,(int *)&local_2f0);
      std::operator+(&local_390,"uniform mediump vec3 u_light",&local_270);
      std::operator+(&local_350,&local_390,"_color${NAME_SPEC};\nuniform mediump vec3 u_light");
      std::operator+(&local_330,&local_350,&local_270);
      std::operator+(&local_310,&local_330,"_direction${NAME_SPEC};\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_390);
      if (iVar1 == 1) {
        std::operator+(&local_2d0,"uniform mediump vec4 u_light",&local_270);
        std::operator+(&local_2b0,&local_2d0,"_position${NAME_SPEC};\nuniform mediump float u_light"
                      );
        std::operator+(&local_290,&local_2b0,&local_270);
        std::operator+(&local_370,&local_290,
                       "_constantAttenuation${NAME_SPEC};\nuniform mediump float u_light");
        std::operator+(&local_390,&local_370,&local_270);
        std::operator+(&local_350,&local_390,
                       "_linearAttenuation${NAME_SPEC};\nuniform mediump float u_light");
        std::operator+(&local_330,&local_350,&local_270);
        std::operator+(&local_310,&local_330,"_quadraticAttenuation${NAME_SPEC};\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      std::__cxx11::string::~string((string *)&local_270);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((char)local_398 == '\0') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (iVar1 == 1) {
      de::toString<int>(&local_390,&local_39c);
      std::operator+(&local_350,"varying mediump vec3 v_directionToLight${NAME_SPEC}[",&local_390);
      std::operator+(&local_330,&local_350,
                     "];\nvarying mediump float v_distanceToLight${NAME_SPEC}[");
      de::toString<int>(&local_370,&local_39c);
      std::operator+(&local_310,&local_330,&local_370);
      std::operator+(&local_270,&local_310,"];\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_390);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (iVar1 == 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((char)local_398 == '\0') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (local_394 = 0; local_394 < local_39c; local_394 = local_394 + 1) {
      de::toString<int>(&local_270,&local_394);
      std::operator+(&local_330,"\t/* Light ",&local_270);
      std::operator+(&local_310,&local_330," */\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      if (iVar1 == 0) {
        std::operator+(&local_250,"\tmediump vec3 directionToLight",&local_270);
        std::operator+(&local_230,&local_250," = -u_light");
        std::operator+(&local_210,&local_230,&local_270);
        std::operator+(&local_1f0,&local_210,"_direction${NAME_SPEC};\n\tmediump vec3 halfVector");
        std::operator+(&local_1d0,&local_1f0,&local_270);
        std::operator+(&local_2f0,&local_1d0," = normalize(directionToLight");
        std::operator+(&local_2d0,&local_2f0,&local_270);
        std::operator+(&local_2b0,&local_2d0,
                       " + vec3(0.0, 0.0, 1.0));\n\tcolor.rgb += computeLighting(directionToLight");
        std::operator+(&local_290,&local_2b0,&local_270);
        std::operator+(&local_370,&local_290,", halfVector");
        std::operator+(&local_390,&local_370,&local_270);
        std::operator+(&local_350,&local_390,", eyeNormal, u_light");
        std::operator+(&local_330,&local_350,&local_270);
        std::operator+(&local_310,&local_330,
                       "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC});\n\n"
                      );
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        this_00 = &local_250;
LAB_00412faf:
        std::__cxx11::string::~string((string *)this_00);
      }
      else if (iVar1 == 1) {
        std::operator+(&local_1b0,"\tmediump vec3 directionToLight",&local_270);
        std::operator+(&local_190,&local_1b0," = normalize(v_directionToLight${NAME_SPEC}[");
        std::operator+(&local_170,&local_190,&local_270);
        std::operator+(&local_150,&local_170,"]);\n\tmediump float distanceToLight");
        std::operator+(&local_130,&local_150,&local_270);
        std::operator+(&local_110,&local_130," = v_distanceToLight${NAME_SPEC}[");
        std::operator+(&local_f0,&local_110,&local_270);
        std::operator+(&local_d0,&local_f0,"];\n\tmediump vec3 halfVector");
        std::operator+(&local_b0,&local_d0,&local_270);
        std::operator+(&local_90,&local_b0," = normalize(directionToLight");
        std::operator+(&local_70,&local_90,&local_270);
        std::operator+(&local_50,&local_70,
                       " + vec3(0.0, 0.0, 1.0));\n\tcolor.rgb += computeLighting(directionToLight");
        std::operator+(&local_250,&local_50,&local_270);
        std::operator+(&local_230,&local_250,", halfVector");
        std::operator+(&local_210,&local_230,&local_270);
        std::operator+(&local_1f0,&local_210,", eyeNormal, u_light");
        std::operator+(&local_1d0,&local_1f0,&local_270);
        std::operator+(&local_2f0,&local_1d0,
                       "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC}) * computeDistanceAttenuation(distanceToLight"
                      );
        std::operator+(&local_2d0,&local_2f0,&local_270);
        std::operator+(&local_2b0,&local_2d0,", u_light");
        std::operator+(&local_290,&local_2b0,&local_270);
        std::operator+(&local_370,&local_290,"_constantAttenuation${NAME_SPEC}, u_light");
        std::operator+(&local_390,&local_370,&local_270);
        std::operator+(&local_350,&local_390,"_linearAttenuation${NAME_SPEC}, u_light");
        std::operator+(&local_330,&local_350,&local_270);
        std::operator+(&local_310,&local_330,"_quadraticAttenuation${NAME_SPEC});\n\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        this_00 = &local_1b0;
        goto LAB_00412faf;
      }
      std::__cxx11::string::~string((string *)&local_270);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string lightFragmentTemplate (int numLights, bool isVertexCase, LightType lightType)
{
	string resultTemplate;

	if (!isVertexCase)
	{
		resultTemplate +=
			"uniform mediump vec3 u_material_ambientColor${NAME_SPEC};\n"
			"uniform mediump vec4 u_material_diffuseColor${NAME_SPEC};\n"
			"uniform mediump vec3 u_material_emissiveColor${NAME_SPEC};\n"
			"uniform mediump vec3 u_material_specularColor${NAME_SPEC};\n"
			"uniform mediump float u_material_shininess${NAME_SPEC};\n";

		for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
		{
			string ndxStr = de::toString(lightNdx);

			resultTemplate +=
				"uniform mediump vec3 u_light" + ndxStr + "_color${NAME_SPEC};\n"
				"uniform mediump vec3 u_light" + ndxStr + "_direction${NAME_SPEC};\n";

			if (lightType == LIGHT_POINT)
				resultTemplate +=
					"uniform mediump vec4 u_light" + ndxStr + "_position${NAME_SPEC};\n"
					"uniform mediump float u_light" + ndxStr + "_constantAttenuation${NAME_SPEC};\n"
					"uniform mediump float u_light" + ndxStr + "_linearAttenuation${NAME_SPEC};\n"
					"uniform mediump float u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC};\n";
		}
	}

	resultTemplate +=
		"uniform sampler2D u_sampler0${NAME_SPEC};\n"
		"varying mediump vec4 v_color${NAME_SPEC};\n"
		"varying mediump vec2 v_texCoord0${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		resultTemplate +=
			"varying mediump vec3 v_eyeNormal${NAME_SPEC};\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"varying mediump vec3 v_directionToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n"
				"varying mediump float v_distanceToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n";

		resultTemplate +=
			"mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n"
			"{\n"
			"	return vec3(to.xyz * from.w - from.xyz * to.w);\n"
			"}\n"
			"\n";

		resultTemplate +=
			"mediump vec3 computeLighting (\n"
			"	mediump vec3 directionToLight,\n"
			"	mediump vec3 halfVector,\n"
			"	mediump vec3 normal,\n"
			"	mediump vec3 lightColor,\n"
			"	mediump vec3 diffuseColor,\n"
			"	mediump vec3 specularColor,\n"
			"	mediump float shininess)\n"
			"{\n"
			"	mediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n"
			"	mediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n"
			"\n"
			"	if (normalDotDirection != 0.0)\n"
			"		color += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n"
			"\n"
			"	return color;\n"
			"}\n"
			"\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n"
				"{\n"
				"	return 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n"
				"}\n"
				"\n";
	}

	resultTemplate +=
		"void main (void)\n"
		"{\n"
		"	mediump vec2 texCoord0 = v_texCoord0${NAME_SPEC}.xy;\n"
		"	mediump vec4 color = v_color${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		resultTemplate +=
			"	mediump vec3 eyeNormal = normalize(v_eyeNormal${NAME_SPEC});\n"
			"\n";

		for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
		{
			string ndxStr = de::toString(lightNdx);

			resultTemplate +=
				"	/* Light " + ndxStr + " */\n";

			if (lightType == LIGHT_POINT)
				resultTemplate +=
					"	mediump vec3 directionToLight" + ndxStr + " = normalize(v_directionToLight${NAME_SPEC}[" + ndxStr + "]);\n"
					"	mediump float distanceToLight" + ndxStr + " = v_distanceToLight${NAME_SPEC}[" + ndxStr + "];\n"
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, "
					"u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC}) * computeDistanceAttenuation(distanceToLight" + ndxStr + ", u_light" + ndxStr + "_constantAttenuation${NAME_SPEC}, "
					"u_light" + ndxStr + "_linearAttenuation${NAME_SPEC}, u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC});\n"
					"\n";
			else if (lightType == LIGHT_DIRECTIONAL)
				resultTemplate +=
					"	mediump vec3 directionToLight" + ndxStr + " = -u_light" + ndxStr + "_direction${NAME_SPEC};\n"
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC});\n"
					"\n";
			else
				DE_ASSERT(DE_FALSE);
		}
	}

	resultTemplate +=
		"	color *= texture2D(u_sampler0${NAME_SPEC}, texCoord0);\n"
		"	gl_FragColor = color + ${FLOAT01};\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}